

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

QString * __thiscall
QLocale::dateTimeFormat(QString *__return_storage_ptr__,QLocale *this,FormatType format)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  QSystemLocale *pQVar5;
  long in_FS_OFFSET;
  QString local_b8;
  anon_union_24_3_e3d07ef4_for_data local_98;
  undefined1 *puStack_80;
  QArrayData *local_78;
  char16_t *pcStack_70;
  qsizetype local_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->d).d.ptr)->m_data == &systemLocaleData) {
    local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar5 = systemLocale();
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = (undefined1 *)0x0;
    local_58._16_8_ = (undefined1 *)0x0;
    local_40 = 2;
    (*pQVar5->_vptr_QSystemLocale[2])(&local_98,pQVar5,(ulong)(0x16 - (format == LongFormat)));
    ::QVariant::~QVariant((QVariant *)&local_58);
    bVar4 = ::QVariant::isNull((QVariant *)&local_98);
    if (bVar4) {
      ::QVariant::~QVariant((QVariant *)&local_98);
    }
    else {
      ::QVariant::toString(__return_storage_ptr__,(QVariant *)&local_98);
      ::QVariant::~QVariant((QVariant *)&local_98);
      if (!bVar4) goto LAB_0031299c;
    }
  }
  dateFormat((QString *)&local_58,this,format);
  uVar3 = local_58._16_8_;
  uVar2 = local_58._8_8_;
  uVar1 = local_58.shared;
  local_58.shared = (PrivateShared *)0x0;
  local_58._8_8_ = (undefined1 *)0x0;
  local_58._16_8_ = (undefined1 *)0x0;
  timeFormat(&local_b8,this,format);
  local_68 = local_b8.d.size;
  pcStack_70 = local_b8.d.ptr;
  local_78 = &(local_b8.d.d)->super_QArrayData;
  local_98.shared = (PrivateShared *)uVar1;
  local_98._8_8_ = uVar2;
  local_98._16_8_ = uVar3;
  puStack_80 = (undefined1 *)CONCAT62(puStack_80._2_6_,0x20);
  local_b8.d.d = (Data *)0x0;
  local_b8.d.ptr = (char16_t *)0x0;
  local_b8.d.size = 0;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::convertTo<QString>
            (__return_storage_ptr__,
             (QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *)&local_98);
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder
            ((QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *)&local_98);
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_58.shared)->ref)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)&(local_58.shared)->ref)->_q_value).super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_58.shared)->ref)->_q_value).super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
    }
  }
LAB_0031299c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::dateTimeFormat(FormatType format) const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        QVariant res = systemLocale()->query(format == LongFormat
                                             ? QSystemLocale::DateTimeFormatLong
                                             : QSystemLocale::DateTimeFormatShort,
                                             QVariant());
        if (!res.isNull()) {
            return res.toString();
        }
    }
#endif
    return dateFormat(format) + u' ' + timeFormat(format);
}